

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageImage(Instruction *this)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  uint32_t uVar3;
  Instruction *this_00;
  uint uVar4;
  
  if (this->opcode_ != OpTypePointer) {
    return false;
  }
  uVar3 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar3 = (uint)this->has_result_id_;
  }
  uVar3 = GetSingleWordOperand(this,uVar3);
  if (uVar3 == 0) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pDVar2 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar4 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar4 = (uint)this->has_result_id_;
    }
    uVar3 = GetSingleWordOperand(this,uVar4 + 1);
    this_00 = analysis::DefUseManager::GetDef(pDVar2,uVar3);
    if ((this_00->opcode_ & ~OpUndef) == OpTypeArray) {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pDVar2 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      uVar3 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar3 = (uint)this_00->has_result_id_;
      }
      uVar3 = GetSingleWordOperand(this_00,uVar3);
      this_00 = analysis::DefUseManager::GetDef(pDVar2,uVar3);
    }
    if (this_00->opcode_ == OpTypeImage) {
      uVar4 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar4 = (uint)this_00->has_result_id_;
      }
      uVar3 = GetSingleWordOperand(this_00,uVar4 + 1);
      if (uVar3 != 5) {
        uVar4 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar4 = (uint)this_00->has_result_id_;
        }
        uVar3 = GetSingleWordOperand(this_00,uVar4 + 5);
        return uVar3 != 1;
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageImage() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::UniformConstant) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeImage) {
    return false;
  }

  if (spv::Dim(base_type->GetSingleWordInOperand(kTypeImageDimIndex)) ==
      spv::Dim::Buffer) {
    return false;
  }

  // Check if the image is sampled.  If we do not know for sure that it is,
  // then assume it is a storage image.
  return base_type->GetSingleWordInOperand(kTypeImageSampledIndex) != 1;
}